

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_sorted.c
# Opt level: O0

rb_node * rb_iter_traversal(rb_node *current_state,rb_node **next_state)

{
  rb_node *prVar1;
  rb_node *local_38;
  rb_node *next;
  rb_node *parent;
  rb_node *iter;
  rb_node **next_state_local;
  rb_node *current_state_local;
  
  parent = current_state;
  do {
    if (parent == (rb_node *)0x0) {
      return (rb_node *)0x0;
    }
    if (parent->left == (rb_node *)0x0) {
      if (parent->right == (rb_node *)0x0) {
        prVar1 = parent->parent;
        *next_state = prVar1;
        if ((prVar1 == (rb_node *)0x0) || (prVar1->left != parent)) {
          if ((prVar1 != (rb_node *)0x0) && (prVar1->right == parent)) {
            prVar1->right = (rb_node *)0x0;
          }
        }
        else {
          prVar1->left = (rb_node *)0x0;
        }
        return parent;
      }
      local_38 = parent->right;
    }
    else {
      local_38 = parent->left;
    }
    parent = local_38;
  } while( true );
}

Assistant:

static struct rb_node *
rb_iter_traversal(struct rb_node *current_state, struct rb_node **next_state)
{
    struct rb_node *iter, *parent, *next;

    for (iter = current_state; iter; iter = next) {
        if (RBN_LEFT(iter)) {
            next = RBN_LEFT(iter);
            continue;
        } else if (RBN_RIGHT(iter)) {
            next = RBN_RIGHT(iter);
            continue;
        }

        *next_state = parent = RBN_PARENT(iter);

        if (parent && (RBN_LEFT(parent) == iter)) {
            RBN_LEFT(parent) = NULL;
        } else if (parent && (RBN_RIGHT(parent) == iter)) {
            RBN_RIGHT(parent) = NULL;
        }

        return iter;
    }

    return NULL;
}